

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::(anonymous_namespace)::
multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
::
insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,true>>,int&,int*>>
          (multi_checker<phmap::btree_multiset<int,phmap::Less<int>,std::allocator<int>>,std::multiset<int,std::less<int>,std::allocator<int>>>
           *this,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                 b,btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
                   e)

{
  ulong uVar1;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
  local_30;
  
  uVar1 = b._8_8_;
  local_30.node = b.node;
  local_30.position = b.position;
  if (local_30.position != e.position || local_30.node != e.node) {
    do {
      if (((ulong)local_30.node & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                      ,0xf84,
                      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                     );
      }
      anon_unknown_0::
      multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
      ::insert((multi_checker<phmap::btree_multiset<int,_phmap::Less<int>,_std::allocator<int>_>,_std::multiset<int,_std::less<int>,_std::allocator<int>_>_>
                *)this,(value_type *)(local_30.node + (long)(int)uVar1 * 4 + 0xc));
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>,_int_&,_int_*>
      ::increment(&local_30);
      uVar1 = (ulong)(uint)local_30.position;
    } while (local_30.position != e.position || local_30.node != e.node);
  }
  return;
}

Assistant:

void insert(InputIterator b, InputIterator e) {
            for (; b != e; ++b) {
                insert(*b);
            }
        }